

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_ObjAddFanins(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vFanins)

{
  ushort uVar1;
  uint uVar2;
  int *piVar3;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *__dest;
  
  if (pObj->nFanins != 0) {
    __assert_fail("pObj->nFanins == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcNtk.c"
                  ,0xbc,"void Wlc_ObjAddFanins(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Int_t *)");
  }
  uVar2 = vFanins->nSize;
  pObj->nFanins = uVar2;
  if ((uVar2 < 3) &&
     ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) != (undefined1  [24])0x6)
     ) {
LAB_002f91e2:
    if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x6) {
      __dest = &pObj->field_8;
      goto LAB_002f91f8;
    }
  }
  else {
    piVar3 = (int *)Mem_FlexEntryFetch(p->pMemFanin,uVar2 << 2);
    (pObj->field_8).pFanins[0] = piVar3;
    if (pObj->nFanins < 3) goto LAB_002f91e2;
  }
  __dest = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__8 *)(pObj->field_8).pFanins[0];
LAB_002f91f8:
  memcpy(__dest,vFanins->pArray,(long)vFanins->nSize << 2);
  uVar1 = *(ushort *)pObj & 0x3f;
  if (uVar1 == 6) {
    uVar2 = 0;
  }
  else {
    if ((uVar1 != 0x2c) && (uVar1 != 0x13)) {
      return;
    }
    uVar2 = 1;
  }
  pObj->nFanins = uVar2;
  return;
}

Assistant:

void Wlc_ObjAddFanins( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vFanins )
{
    assert( pObj->nFanins == 0 );
    pObj->nFanins = Vec_IntSize(vFanins);
    if ( Wlc_ObjHasArray(pObj) )
        pObj->pFanins[0] = (int *)Mem_FlexEntryFetch( p->pMemFanin, Vec_IntSize(vFanins) * sizeof(int) );
    memcpy( Wlc_ObjFanins(pObj), Vec_IntArray(vFanins), sizeof(int) * Vec_IntSize(vFanins) );
    // special treatment of CONST, SELECT and TABLE
    if ( pObj->Type == WLC_OBJ_CONST )
        pObj->nFanins = 0;
    else if ( pObj->Type == WLC_OBJ_BIT_SELECT || pObj->Type == WLC_OBJ_TABLE )
        pObj->nFanins = 1;
}